

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_TestFailure_BinaryEqualTwoBytes_TestShell::createTest
          (TEST_TestFailure_BinaryEqualTwoBytes_TestShell *this)

{
  TEST_TestFailure_BinaryEqualTwoBytes_Test *this_00;
  TEST_TestFailure_BinaryEqualTwoBytes_TestShell *this_local;
  
  this_00 = (TEST_TestFailure_BinaryEqualTwoBytes_Test *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
                         ,0x14d);
  TEST_TestFailure_BinaryEqualTwoBytes_Test::TEST_TestFailure_BinaryEqualTwoBytes_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestFailure, BinaryEqualTwoBytes)
{
    const unsigned char expectedData[] = {0x00, 0x01};
    const unsigned char actualData[] = {0x00, 0x02};
    BinaryEqualFailure f(test, failFileName, failLineNumber, expectedData, actualData, sizeof(expectedData), "");
    FAILURE_EQUAL("expected <00 01>\n"
                "\tbut was  <00 02>\n"
    			"\tdifference starts at position 1 at: <      00 02         >\n"
    			"\t                                               ^", f);
}